

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

int __thiscall slang::parsing::Token::init(Token *this,EVP_PKEY_CTX *ctx)

{
  size_t sVar1;
  Info *pIVar2;
  undefined8 in_RCX;
  char cVar3;
  TokenKind in_DX;
  size_t size;
  ulong in_R8;
  SourceLocation in_R9;
  uint32_t in_stack_00000008;
  char *in_stack_00000010;
  
  this->kind = in_DX;
  *(undefined2 *)&this->field_0x2 = 0;
  this->rawLen = in_stack_00000008;
  sVar1 = getExtraSize(in_DX);
  if (in_R8 == 0) {
    size = sVar1 + 0x10;
  }
  else {
    cVar3 = '\x1e';
    if (in_R8 < 0xf) {
      cVar3 = (char)in_R8 * '\x02';
    }
    size = sVar1 + 0x18;
    if (in_R8 >= 0xf) {
      size = sVar1 + 0x20;
    }
    this->field_0x2 = cVar3;
  }
  pIVar2 = (Info *)BumpAllocator::allocate((BumpAllocator *)ctx,size,8);
  this->info = pIVar2;
  pIVar2->location = in_R9;
  pIVar2 = this->info;
  pIVar2->rawTextPtr = in_stack_00000010;
  if ((in_R8 != 0) && (*(undefined8 *)((long)&pIVar2[1].rawTextPtr + sVar1) = in_RCX, 0xe < in_R8))
  {
    *(ulong *)(&pIVar2[1].location.field_0x0 + sVar1) = in_R8;
  }
  return (int)pIVar2;
}

Assistant:

void Token::init(BumpAllocator& alloc, TokenKind kind_, std::span<Trivia const> trivia,
                 std::string_view rawText, SourceLocation location) {
    kind = kind_;
    missing = false;
    triviaCountSmall = 0;
    reserved = 0;
    numFlags.raw = 0;
    rawLen = uint32_t(rawText.size());

    size_t extra = getExtraSize(kind);
    SLANG_ASSERT(extra % alignof(void*) == 0);

    size_t size = sizeof(Info) + extra;
    if (!trivia.empty()) {
        size += sizeof(Trivia*);
        if (trivia.size() > MaxTriviaSmallCount) {
            size += sizeof(size_t);
            triviaCountSmall = MaxTriviaSmallCount + 1;
        }
        else {
            triviaCountSmall = uint8_t(trivia.size());
        }
    }

    info = (Info*)alloc.allocate(size, alignof(Info));
    info->location = location;
    info->rawTextPtr = rawText.data();

    if (!trivia.empty()) {
        const Trivia* triviaPtr = trivia.data();
        byte* dest = info->extra() + extra;
        memcpy(dest, reinterpret_cast<const void*>(&triviaPtr), sizeof(triviaPtr));

        if (trivia.size() > MaxTriviaSmallCount) {
            size = trivia.size();
            memcpy(dest + sizeof(triviaPtr), &size, sizeof(size_t));
        }
    }
}